

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float64_to_floatx80_mips64(float64 a,float_status *status)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  floatx80 fVar6;
  floatx80 fVar7;
  undefined1 in_stack_00000008 [24];
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar3 = a & 0xfffffffffffff;
  uVar4 = (uint)(a >> 0x20);
  uVar5 = uVar4 >> 0x14 & 0x7ff;
  iVar2 = (int)uVar4 >> 0x1f;
  if (uVar5 == 0) {
    if (uVar3 == 0) {
      return (floatx80)(ZEXT416((uint)(iVar2 * -0x8000)) << 0x40);
    }
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar3 = uVar3 << ((byte)uVar4 & 0x3f);
    uVar5 = 1 - (uVar4 & 0xff);
LAB_0086b5b3:
    fVar6.low = uVar3 << 0xb | 0x8000000000000000;
    fVar6._8_4_ = iVar2 * -0x8000 + uVar5 + 0x3c00;
    fVar6._12_4_ = 0;
    return fVar6;
  }
  if (uVar5 != 0x7ff) goto LAB_0086b5b3;
  if (uVar3 == 0) {
    fVar7._8_4_ = iVar2 * -0x8000 | 0x7fff;
    fVar7.low = 0x8000000000000000;
    fVar7._12_4_ = 0;
    return fVar7;
  }
  if (status->snan_bit_is_one == '\0') {
    if ((a & 0x7ffffffffffff) == 0 || (a & 0x7ff8000000000000) != 0x7ff0000000000000)
    goto LAB_0086b585;
  }
  else if ((uVar4 >> 0x13 & 0xfff) < 0xfff) goto LAB_0086b585;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_0086b585:
  fVar6 = commonNaNToFloatx80((commonNaNT)in_stack_00000008,(float_status *)(a >> 0x3f));
  return fVar6;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}